

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

Expression *
slang::ast::bindTerminal
          (ExpressionSyntax *syntax,SpecifyTerminalDir dir,Scope *parentParent,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ElementSelectExpression *this;
  RangeSelectExpression *this_00;
  SourceLocation in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  SourceLocation in_RDI;
  SourceRange in_stack_00000000;
  ValueSymbol *symbol;
  DiagCode code;
  Expression *valueExpr;
  Expression *expr;
  Expression *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  ExpressionKind EVar3;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode code_00;
  SyntaxNode *local_58;
  Expression *local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  Expression *local_30;
  SpecifyTerminalDir dir_00;
  undefined4 in_stack_ffffffffffffffe8;
  SourceLocation type;
  ValueSymbol *in_stack_fffffffffffffff8;
  
  dir_00 = (SpecifyTerminalDir)((ulong)in_RDX >> 0x20);
  code_00 = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  type = in_RDI;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_38,None);
  iVar2 = Expression::bind(in_RDI._0_4_,(sockaddr *)in_RCX,(socklen_t)local_38.m_bits);
  local_30 = (Expression *)CONCAT44(extraout_var,iVar2);
  bVar1 = Expression::bad(in_stack_ffffffffffffff60);
  if (bVar1) {
    return (Expression *)0x0;
  }
  EVar3 = local_30->kind;
  if (EVar3 == ElementSelect) {
    this = Expression::as<slang::ast::ElementSelectExpression>(local_30);
    local_40 = ElementSelectExpression::value(this);
  }
  else if (EVar3 == RangeSelect) {
    this_00 = Expression::as<slang::ast::RangeSelectExpression>(local_30);
    local_40 = RangeSelectExpression::value(this_00);
  }
  else {
    local_40 = local_30;
  }
  if (local_40->kind == NamedValue) {
LAB_00442948:
    Expression::as<slang::ast::ValueExpressionBase>(local_40);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x442973);
    bVar1 = SpecifyBlockSymbol::checkPathTerminal
                      (in_stack_fffffffffffffff8,(Type *)type,
                       (Scope *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),dir_00,in_stack_00000000)
    ;
    if (bVar1) {
      return local_30;
    }
  }
  else {
    if (local_40->kind == HierarchicalValue) {
      Expression::as<slang::ast::HierarchicalValueExpression>(local_40);
      bVar1 = HierarchicalReference::isViaIfacePort
                        ((HierarchicalReference *)in_stack_ffffffffffffff60);
      if (bVar1) goto LAB_00442948;
    }
    slang::syntax::SyntaxNode::sourceRange(local_58);
    sourceRange.endLoc = in_RCX;
    sourceRange.startLoc = in_RDI;
    ASTContext::addDiag((ASTContext *)CONCAT44(EVar3,in_stack_ffffffffffffff78),code_00,sourceRange)
    ;
  }
  return (Expression *)0x0;
}

Assistant:

static const Expression* bindTerminal(const ExpressionSyntax& syntax,
                                      SpecifyBlockSymbol::SpecifyTerminalDir dir,
                                      const Scope* parentParent, ASTContext& context) {
    auto expr = &Expression::bind(syntax, context);
    if (expr->bad())
        return nullptr;

    const Expression* valueExpr;
    switch (expr->kind) {
        case ExpressionKind::ElementSelect:
            valueExpr = &expr->as<ElementSelectExpression>().value();
            break;
        case ExpressionKind::RangeSelect:
            valueExpr = &expr->as<RangeSelectExpression>().value();
            break;
        default:
            valueExpr = expr;
            break;
    }

    if (valueExpr->kind != ExpressionKind::NamedValue &&
        (valueExpr->kind != ExpressionKind::HierarchicalValue ||
         !valueExpr->as<HierarchicalValueExpression>().ref.isViaIfacePort())) {
        auto code = (valueExpr->kind == ExpressionKind::ElementSelect ||
                     valueExpr->kind == ExpressionKind::RangeSelect)
                        ? diag::SpecifyPathMultiDim
                        : diag::InvalidSpecifyPath;
        context.addDiag(code, syntax.sourceRange());
    }
    else {
        auto& symbol = valueExpr->as<ValueExpressionBase>().symbol;
        if (SpecifyBlockSymbol::checkPathTerminal(symbol, *expr->type, *parentParent, dir,
                                                  valueExpr->sourceRange)) {
            return expr;
        }
    }

    return nullptr;
}